

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O0

JavascriptExceptionObject * __thiscall
Js::JavascriptExceptionObject::CloneIfStaticExceptionObject
          (JavascriptExceptionObject *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptExceptionObject *pJVar4;
  void **ppvVar5;
  JavascriptLibrary *pJVar6;
  Recycler *pRVar7;
  TrackAllocData local_98;
  JavascriptError *local_70;
  Var thrownObject_1;
  undefined8 local_60;
  TrackAllocData local_58;
  JavascriptError *local_30;
  Var thrownObject;
  JavascriptExceptionObject *exceptionObject;
  ThreadContext *threadContext;
  ScriptContext *scriptContext_local;
  JavascriptExceptionObject *this_local;
  
  threadContext = (ThreadContext *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionObject.cpp"
                                ,0x1a,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  exceptionObject =
       (JavascriptExceptionObject *)ScriptContext::GetThreadContext((ScriptContext *)threadContext);
  thrownObject = this;
  pJVar4 = ThreadContext::GetPendingOOMErrorObject((ThreadContext *)exceptionObject);
  if (this == pJVar4) {
    ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)this);
    if (*ppvVar5 != (void *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionObject.cpp"
                                  ,0x21,"(this->thrownObject == __null)",
                                  "ThrownObject should be NULL since at time of OOM we will not be able to allocate the thrownObject"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pJVar6 = ScriptContext::GetLibrary((ScriptContext *)threadContext);
    local_30 = JavascriptLibrary::CreateOutOfMemoryError(pJVar6);
    pRVar7 = ScriptContext::GetRecycler((ScriptContext *)threadContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionObject.cpp"
               ,0x2b);
    pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_58);
    thrownObject_1 = Memory::Recycler::AllocInlined;
    local_60 = 0;
    pJVar4 = (JavascriptExceptionObject *)new<Memory::Recycler>(0x50,pRVar7,0x43c4b0);
    JavascriptExceptionObject
              (pJVar4,local_30,(ScriptContext *)threadContext,&this->exceptionContext,false);
    thrownObject = pJVar4;
    ThreadContext::ClearPendingOOMError((ThreadContext *)exceptionObject);
  }
  pJVar4 = ThreadContext::GetPendingSOErrorObject((ThreadContext *)exceptionObject);
  if (this == pJVar4) {
    local_70 = (JavascriptError *)0x0;
    ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)this);
    if (*ppvVar5 == (void *)0x0) {
      bVar2 = ThreadContext::IsJSRT((ThreadContext *)exceptionObject);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionObject.cpp"
                                    ,0x35,"(threadContext->IsJSRT())",
                                    "ThrownObject could be NULL for Jsrt scenarios because it is cleared in ~EnterScriptEnd. For non-jsrt cases, we should always have an allocated thrown object."
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pJVar6 = ScriptContext::GetLibrary((ScriptContext *)threadContext);
      local_70 = JavascriptLibrary::CreateStackOverflowError(pJVar6);
    }
    else {
      local_70 = (JavascriptError *)GetThrownObject(this,(ScriptContext *)threadContext);
    }
    pRVar7 = ScriptContext::GetRecycler((ScriptContext *)threadContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_98,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionObject.cpp"
               ,0x41);
    pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_98);
    pJVar4 = (JavascriptExceptionObject *)new<Memory::Recycler>(0x50,pRVar7,0x43c4b0);
    JavascriptExceptionObject
              (pJVar4,local_70,(ScriptContext *)threadContext,&this->exceptionContext,false);
    thrownObject = pJVar4;
    ThreadContext::ClearPendingSOError((ThreadContext *)exceptionObject);
  }
  return (JavascriptExceptionObject *)thrownObject;
}

Assistant:

JavascriptExceptionObject* JavascriptExceptionObject::CloneIfStaticExceptionObject(ScriptContext* scriptContext)
    {
        Assert(scriptContext);

        ThreadContext *threadContext = scriptContext->GetThreadContext();
        JavascriptExceptionObject* exceptionObject = this;

        if (this == threadContext->GetPendingOOMErrorObject())
        {
            AssertMsg(this->thrownObject == NULL, "ThrownObject should be NULL since at time of OOM we will not be able to allocate the thrownObject");

            // Let's hope that unwinding has released enough pointers that the
            // recycler will find some memory to allocate the real OutOfMemory object.
            // If not, it will rethrow outOfMemory
            Var thrownObject = scriptContext->GetLibrary()->CreateOutOfMemoryError();
            exceptionObject = RecyclerNew(scriptContext->GetRecycler(),
                JavascriptExceptionObject,
                thrownObject,
                scriptContext,
                &this->exceptionContext);
            threadContext->ClearPendingOOMError();
        }

        if (this == threadContext->GetPendingSOErrorObject())
        {
            Var thrownObject = NULL;

            if (this->thrownObject == NULL)
            {
                AssertMsg(threadContext->IsJSRT(), "ThrownObject could be NULL for Jsrt scenarios because it is cleared in ~EnterScriptEnd. For non-jsrt cases, we should always have an allocated thrown object.");
                thrownObject = scriptContext->GetLibrary()->CreateStackOverflowError();
            }
            else
            {
                thrownObject = this->GetThrownObject(scriptContext);
            }

            exceptionObject = RecyclerNew(scriptContext->GetRecycler(),
                JavascriptExceptionObject,
                thrownObject,
                scriptContext,
                &this->exceptionContext);
            threadContext->ClearPendingSOError();
        }

        return exceptionObject;
    }